

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O1

void bloaty::wasm::AddWebAssemblyFallback(RangeSink *sink)

{
  ulong *puVar1;
  long *plVar2;
  char *pcVar3;
  undefined8 *puVar4;
  ulong uVar5;
  string_view name;
  string_view name_00;
  string name2;
  ulong *local_128;
  long local_120;
  ulong local_118;
  undefined8 uStack_110;
  long *local_108;
  size_t local_100;
  long local_f8;
  undefined8 uStack_f0;
  ulong *local_e8;
  long local_e0;
  ulong local_d8 [2];
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  undefined1 local_b0;
  undefined1 local_af;
  undefined2 *local_a8;
  undefined8 local_a0;
  undefined2 local_98;
  undefined6 uStack_96;
  string_view local_88;
  Section local_78;
  
  local_88._M_len = (sink->file_->data_)._M_len;
  local_88._M_str = (sink->file_->data_)._M_str;
  ReadMagic(&local_88);
  if (local_88._M_len != 0) {
    do {
      Section::Read(&local_78,&local_88);
      local_b8 = 0x6e6f69746365735b;
      local_b0 = 0x20;
      local_c0 = 9;
      local_af = 0;
      local_e8 = local_d8;
      local_c8 = &local_b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,local_78.name._M_dataplus._M_p,
                 local_78.name._M_dataplus._M_p + local_78.name._M_string_length);
      uVar5 = 0xf;
      if (local_c8 != &local_b8) {
        uVar5 = local_b8;
      }
      if (uVar5 < (ulong)(local_e0 + local_c0)) {
        uVar5 = 0xf;
        if (local_e8 != local_d8) {
          uVar5 = local_d8[0];
        }
        if (uVar5 < (ulong)(local_e0 + local_c0)) goto LAB_001a2c4b;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_c8);
      }
      else {
LAB_001a2c4b:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_e8);
      }
      puVar1 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar1) {
        local_118 = *puVar1;
        uStack_110 = puVar4[3];
        local_128 = &local_118;
      }
      else {
        local_118 = *puVar1;
        local_128 = (ulong *)*puVar4;
      }
      local_120 = puVar4[1];
      *puVar4 = puVar1;
      puVar4[1] = 0;
      *(undefined1 *)puVar1 = 0;
      local_98 = 0x5d;
      local_a0 = 1;
      uVar5 = 0xf;
      if (local_128 != &local_118) {
        uVar5 = local_118;
      }
      local_a8 = &local_98;
      if ((local_120 + 1U < 0x10) && (uVar5 < local_120 + 1U)) {
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_128);
      }
      else {
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_128,(ulong)&local_98);
      }
      plVar2 = puVar4 + 2;
      if ((long *)*puVar4 == plVar2) {
        local_f8 = *plVar2;
        uStack_f0 = puVar4[3];
        local_108 = &local_f8;
      }
      else {
        local_f8 = *plVar2;
        local_108 = (long *)*puVar4;
      }
      local_100 = puVar4[1];
      *puVar4 = plVar2;
      puVar4[1] = 0;
      *(undefined1 *)plVar2 = 0;
      if (local_a8 != &local_98) {
        operator_delete(local_a8,CONCAT62(uStack_96,local_98) + 1);
      }
      if (local_128 != &local_118) {
        operator_delete(local_128,local_118 + 1);
      }
      if (local_e8 != local_d8) {
        operator_delete(local_e8,local_d8[0] + 1);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
      pcVar3 = (sink->file_->data_)._M_str;
      if ((pcVar3 <= local_78.data._M_str) &&
         (local_78.data._M_str < pcVar3 + (sink->file_->data_)._M_len)) {
        name._M_str = (char *)local_108;
        name._M_len = local_100;
        RangeSink::AddFileRange
                  (sink,"wasm_overhead",name,(long)local_78.data._M_str - (long)pcVar3,
                   local_78.data._M_len);
      }
      if (local_108 != &local_f8) {
        operator_delete(local_108,local_f8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.name._M_dataplus._M_p != &local_78.name.field_2) {
        operator_delete(local_78.name._M_dataplus._M_p,
                        local_78.name.field_2._M_allocated_capacity + 1);
      }
    } while (local_88._M_len != 0);
  }
  uVar5 = (sink->file_->data_)._M_len;
  if (7 < uVar5) {
    if (0 < (long)uVar5) {
      name_00._M_str = "[WASM Header]";
      name_00._M_len = 0xd;
      RangeSink::AddFileRange(sink,"wasm_overhead",name_00,0,8);
    }
    return;
  }
  Throw("region out-of-bounds",0x5d);
}

Assistant:

void AddWebAssemblyFallback(RangeSink* sink) {
  ForEachSection(sink->input_file().data(), [sink](const Section& section) {
    std::string name2 =
        std::string("[section ") + std::string(section.name) + std::string("]");
    sink->AddFileRange("wasm_overhead", name2, section.data);
  });
  sink->AddFileRange("wasm_overhead", "[WASM Header]",
                     StrictSubstr(sink->input_file().data(), 0, 8));
}